

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test0.cpp
# Opt level: O0

bool Create_OP_x64_push_pop(JitFuncCreater *jfc,Regs *regs)

{
  bool bVar1;
  byte *pbVar2;
  const_iterator cStack_90;
  byte r_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1_3;
  const_iterator cStack_70;
  byte r_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1_2;
  const_iterator cStack_50;
  byte r_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1_1;
  const_iterator cStack_30;
  byte r;
  const_iterator __end1;
  const_iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range1;
  Regs *regs_local;
  JitFuncCreater *jfc_local;
  
  __end1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&regs->rq);
  cStack_30 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&regs->rq);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1);
    JitFFI::OpCode_x64::push(jfc,(uint)*pbVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1);
  }
  __end1_1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&regs->prq);
  cStack_50 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&regs->prq);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffffb0);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1_1);
    JitFFI::OpCode_x64::push(jfc,(uint)*pbVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&regs->rq);
  cStack_70 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&regs->rq);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_2,&stack0xffffffffffffff90);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1_2);
    JitFFI::OpCode_x64::pop(jfc,(uint)*pbVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&regs->prq);
  cStack_90 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&regs->prq);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_3,&stack0xffffffffffffff70);
    if (!bVar1) break;
    pbVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator*(&__end1_3);
    JitFFI::OpCode_x64::pop(jfc,(uint)*pbVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end1_3);
  }
  JitFFI::OpCode_x64::push_offset_byte(jfc,prax,'\x05');
  JitFFI::OpCode_x64::push_offset_byte(jfc,pr8,'\x05');
  JitFFI::OpCode_x64::push_offset_u32(jfc,prax,5);
  JitFFI::OpCode_x64::push_offset_u32(jfc,pr8,5);
  JitFFI::OpCode_x64::pop_offset_byte(jfc,prax,'\x05');
  JitFFI::OpCode_x64::pop_offset_byte(jfc,pr8,'\x05');
  JitFFI::OpCode_x64::pop_offset_u32(jfc,prax,5);
  JitFFI::OpCode_x64::pop_offset_u32(jfc,pr8,5);
  return true;
}

Assistant:

bool Create_OP_x64_push_pop(JitFuncCreater &jfc, const Regs &regs)
{
	using namespace OpCode_x64;

	for (byte r : regs.rq)
		push(jfc, static_cast<Register>(r));

	for (byte r : regs.prq)
		push(jfc, static_cast<Register>(r));

	for (byte r : regs.rq)
		pop(jfc, static_cast<Register>(r));

	for (byte r : regs.prq)
		pop(jfc, static_cast<Register>(r));

	push_offset_byte(jfc, prax, 5);
	push_offset_byte(jfc, pr8, 5);
	push_offset_u32(jfc, prax, 5);
	push_offset_u32(jfc, pr8, 5);

	pop_offset_byte(jfc, prax, 5);
	pop_offset_byte(jfc, pr8, 5);
	pop_offset_u32(jfc, prax, 5);
	pop_offset_u32(jfc, pr8, 5);

    return true;
}